

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch.cpp
# Opt level: O0

void * clSharedMemAllocINTEL
                 (cl_context context,cl_device_id device,cl_mem_properties_intel *properties,
                 size_t size,cl_uint alignment,cl_int *errcode_ret)

{
  CLIntercept *this;
  CLdispatchX *pCVar1;
  CLIntercept *enqueueCounter_00;
  SConfig *pSVar2;
  undefined8 uVar3;
  time_point tVar4;
  CObjectTracker *this_00;
  size_t in_RCX;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_RDX;
  cl_device_id in_RSI;
  cl_context in_RDI;
  cl_uint in_R8D;
  uint *in_R9;
  time_point cpuEnd;
  time_point cpuStart;
  cl_int localErrorCode;
  string deviceInfo;
  void *retVal;
  cl_mem_properties_intel *newProperties;
  uint64_t enqueueCounter;
  CLdispatchX *dispatchX;
  CLIntercept *pIntercept;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_fffffffffffffd90;
  CLIntercept *in_stack_fffffffffffffd98;
  undefined4 in_stack_fffffffffffffda0;
  undefined4 in_stack_fffffffffffffda4;
  cl_mem_properties_intel **in_stack_fffffffffffffdc0;
  cl_mem_properties_intel *in_stack_fffffffffffffdc8;
  CLIntercept *in_stack_fffffffffffffdd0;
  SConfig *in_stack_fffffffffffffe20;
  SConfig *in_stack_fffffffffffffe28;
  undefined1 includeId;
  SConfig *in_stack_fffffffffffffe30;
  CLIntercept *in_stack_fffffffffffffe38;
  CLIntercept *in_stack_fffffffffffffe40;
  undefined7 in_stack_fffffffffffffe48;
  undefined1 in_stack_fffffffffffffe4f;
  time_point in_stack_fffffffffffffe50;
  time_point in_stack_fffffffffffffe58;
  int local_124 [3];
  string *in_stack_fffffffffffffee8;
  cl_device_id *in_stack_fffffffffffffef0;
  string local_108 [4];
  cl_uint in_stack_fffffffffffffefc;
  CLIntercept *in_stack_ffffffffffffff00;
  undefined8 local_a0;
  uint local_90;
  void *ptr;
  cl_mem_properties_intel *pcVar5;
  char *functionName;
  CLIntercept *this_01;
  uint *local_38;
  
  this = GetIntercept();
  if ((this == (CLIntercept *)0x0) ||
     (pCVar1 = CLIntercept::dispatchX
                         ((CLIntercept *)
                          CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                          (cl_context)in_stack_fffffffffffffd98),
     pCVar1->clSharedMemAllocINTEL ==
     (_func_void_ptr_cl_context_cl_device_id_cl_mem_properties_intel_ptr_size_t_cl_uint_cl_int_ptr *
     )0x0)) {
    local_124[0] = 0;
    std::_Swallow_assign::operator=((_Swallow_assign *)&std::ignore,local_124);
    if (in_R9 != (uint *)0x0) {
      *in_R9 = 0xffffffde;
    }
    return (void *)0x0;
  }
  enqueueCounter_00 = (CLIntercept *)CLIntercept::getEnqueueCounter(in_stack_fffffffffffffd98);
  pcVar5 = (cl_mem_properties_intel *)0x0;
  ptr = (void *)0x0;
  std::__cxx11::string::string((string *)&stack0xffffffffffffff80);
  pSVar2 = CLIntercept::config(this);
  if ((pSVar2->CallLogging & 1U) != 0) {
    CLIntercept::getDeviceInfoString
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffefc,in_stack_fffffffffffffef0,
               in_stack_fffffffffffffee8);
  }
  pSVar2 = CLIntercept::config(this);
  this_01 = enqueueCounter_00;
  if ((pSVar2->CallLogging & 1U) != 0) {
    uVar3 = std::__cxx11::string::c_str();
    in_stack_fffffffffffffd90 = in_RDX;
    CLIntercept::callLoggingEnter
              (this,"clSharedMemAllocINTEL",(uint64_t)enqueueCounter_00,(cl_kernel)0x0,
               "context = %p, device = %s, properties = %p, size = %zu, alignment = %u",in_RDI,uVar3
               ,in_RDX,in_RCX,in_R8D);
  }
  pSVar2 = CLIntercept::config(this);
  if ((pSVar2->RelaxAllocationLimits & 1U) != 0) {
    CLIntercept::usmAllocPropertiesOverride
              (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0);
  }
  local_90 = 0;
  pSVar2 = CLIntercept::config(this);
  local_38 = in_R9;
  if ((((((pSVar2->CallLogging & 1U) != 0) ||
        (pSVar2 = CLIntercept::config(this), (pSVar2->ErrorLogging & 1U) != 0)) ||
       (pSVar2 = CLIntercept::config(this), (pSVar2->ErrorAssert & 1U) != 0)) ||
      (pSVar2 = CLIntercept::config(this), (pSVar2->NoErrors & 1U) != 0)) && (in_R9 == (uint *)0x0))
  {
    local_38 = &stack0xffffffffffffff70;
  }
  std::chrono::
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point(in_stack_fffffffffffffd90);
  std::chrono::
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point(in_stack_fffffffffffffd90);
  pSVar2 = CLIntercept::config(this);
  if (((pSVar2->HostPerformanceTiming & 1U) != 0) ||
     (pSVar2 = CLIntercept::config(this), (pSVar2->ChromeCallLogging & 1U) != 0)) {
    std::chrono::_V2::steady_clock::now();
  }
  if ((ptr == (void *)0x0) && (pcVar5 != (cl_mem_properties_intel *)0x0)) {
    ptr = (*pCVar1->clSharedMemAllocINTEL)(in_RDI,in_RSI,pcVar5,in_RCX,in_R8D,(cl_int *)local_38);
  }
  if (ptr == (void *)0x0) {
    ptr = (*pCVar1->clSharedMemAllocINTEL)
                    (in_RDI,in_RSI,(cl_mem_properties_intel *)in_RDX,in_RCX,in_R8D,
                     (cl_int *)local_38);
  }
  tVar4.__d.__r = (duration)CLIntercept::config(this);
  if (((((SConfig *)tVar4.__d.__r)->HostPerformanceTiming & 1U) != 0) ||
     (in_stack_fffffffffffffe58.__d.__r = (duration)CLIntercept::config(this),
     (((SConfig *)in_stack_fffffffffffffe58.__d.__r)->ChromeCallLogging & 1U) != 0)) {
    local_a0 = std::chrono::_V2::steady_clock::now();
    in_stack_fffffffffffffe50.__d.__r = (duration)CLIntercept::config(this);
    if ((((ulong)(((CLIntercept *)in_stack_fffffffffffffe50.__d.__r)->m_Dispatch).
                 clCreateContextFromType & 1) != 0) &&
       (in_stack_fffffffffffffe4f =
             CLIntercept::checkHostPerformanceTimingEnqueueLimits(this,(uint64_t)this_01),
       (bool)in_stack_fffffffffffffe4f)) {
      in_stack_fffffffffffffe40 = (CLIntercept *)&stack0xffffffffffffff2f;
      in_stack_fffffffffffffe38 = this;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&stack0xffffffffffffff30,"",(allocator *)in_stack_fffffffffffffe40);
      CLIntercept::updateHostTimingStats
                ((CLIntercept *)in_stack_fffffffffffffe50.__d.__r,
                 (char *)CONCAT17(in_stack_fffffffffffffe4f,in_stack_fffffffffffffe48),
                 (string *)in_stack_fffffffffffffe40,tVar4,in_stack_fffffffffffffe58);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff30);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff2f);
    }
  }
  includeId = (undefined1)((ulong)in_stack_fffffffffffffe28 >> 0x38);
  if (ptr != (void *)0x0) {
    in_stack_fffffffffffffe30 = CLIntercept::config(this);
    if (((((in_stack_fffffffffffffe30->DumpBuffersBeforeEnqueue & 1U) == 0) &&
         (in_stack_fffffffffffffe28 = CLIntercept::config(this),
         (in_stack_fffffffffffffe28->DumpBuffersAfterEnqueue & 1U) == 0)) &&
        (in_stack_fffffffffffffe20 = CLIntercept::config(this),
        (in_stack_fffffffffffffe20->InjectBuffers & 1U) == 0)) &&
       (pSVar2 = CLIntercept::config(this), (pSVar2->InjectImages & 1U) == 0)) {
      pSVar2 = CLIntercept::config(this);
      includeId = (undefined1)((ulong)in_stack_fffffffffffffe28 >> 0x38);
      if ((pSVar2->CaptureReplay & 1U) == 0) goto LAB_0017a842;
    }
    includeId = (undefined1)((ulong)in_stack_fffffffffffffe28 >> 0x38);
    CLIntercept::addUSMAllocation
              (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,(size_t)in_stack_fffffffffffffdc0
              );
  }
LAB_0017a842:
  if (pcVar5 != (cl_mem_properties_intel *)0x0) {
    operator_delete__(pcVar5);
  }
  functionName = (char *)0x0;
  pSVar2 = CLIntercept::config(this);
  if (((((pSVar2->ErrorLogging & 1U) != 0) ||
       (pSVar2 = CLIntercept::config(this), (pSVar2->ErrorAssert & 1U) != 0)) ||
      (pSVar2 = CLIntercept::config(this), (pSVar2->NoErrors & 1U) != 0)) && (*local_38 != 0)) {
    pSVar2 = CLIntercept::config(this);
    if ((pSVar2->ErrorLogging & 1U) != 0) {
      CLIntercept::logError(this_01,functionName,(cl_int)((ulong)ptr >> 0x20));
    }
    pSVar2 = CLIntercept::config(this);
    if ((pSVar2->ErrorAssert & 1U) != 0) {
      raise(5);
    }
    pSVar2 = CLIntercept::config(this);
    if ((pSVar2->NoErrors & 1U) != 0) {
      *local_38 = 0;
    }
  }
  pSVar2 = CLIntercept::config(this);
  if ((pSVar2->LeakChecking & 1U) != 0) {
    this_00 = CLIntercept::objectTracker(this);
    CObjectTracker::AddPointerAllocation(this_00,ptr);
  }
  pSVar2 = CLIntercept::config(this);
  if ((pSVar2->CallLogging & 1U) != 0) {
    CLIntercept::callLoggingExit
              (this,"clSharedMemAllocINTEL",(cl_int)(ulong)*local_38,(cl_event *)0x0,
               (cl_sync_point_khr *)0x0,"returned %p",ptr);
  }
  pSVar2 = CLIntercept::config(this);
  if ((pSVar2->ChromeCallLogging & 1U) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_108,"",(allocator *)&stack0xfffffffffffffef7);
    local_124._4_8_ = local_a0;
    tVar4.__d.__r._7_1_ = in_stack_fffffffffffffe4f;
    tVar4.__d.__r._0_7_ = in_stack_fffffffffffffe48;
    CLIntercept::chromeCallLoggingExit
              (in_stack_fffffffffffffe40,(char *)in_stack_fffffffffffffe38,
               (string *)in_stack_fffffffffffffe30,(bool)includeId,
               (uint64_t)in_stack_fffffffffffffe20,in_stack_fffffffffffffe50,tVar4);
    std::__cxx11::string::~string(local_108);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffef7);
  }
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff80);
  return ptr;
}

Assistant:

CL_API_ENTRY void* CL_API_CALL clSharedMemAllocINTEL(
    cl_context context,
    cl_device_id device,
    const cl_mem_properties_intel* properties,
    size_t size,
    cl_uint alignment,
    cl_int* errcode_ret)
{
    CLIntercept*    pIntercept = GetIntercept();

    if( pIntercept )
    {
        const auto& dispatchX = pIntercept->dispatchX(context);
        if( dispatchX.clSharedMemAllocINTEL )
        {
            GET_ENQUEUE_COUNTER();

            cl_mem_properties_intel*    newProperties = NULL;
            void*   retVal = NULL;

            std::string deviceInfo;
            if( pIntercept->config().CallLogging )
            {
                pIntercept->getDeviceInfoString(
                    1,
                    &device,
                    deviceInfo );
            }
            // TODO: Make properties string.
            CALL_LOGGING_ENTER( "context = %p, device = %s, properties = %p, size = %zu, alignment = %u",
                context,
                deviceInfo.c_str(),
                properties,
                size,
                alignment );
            USM_ALLOC_OVERRIDE_INIT( properties, newProperties );
            CHECK_ERROR_INIT( errcode_ret );
            HOST_PERFORMANCE_TIMING_START();

            if( ( retVal == NULL ) && newProperties )
            {
                retVal = dispatchX.clSharedMemAllocINTEL(
                    context,
                    device,
                    newProperties,
                    size,
                    alignment,
                    errcode_ret );
            }
            if( retVal == NULL )
            {
                retVal = dispatchX.clSharedMemAllocINTEL(
                    context,
                    device,
                    properties,
                    size,
                    alignment,
                    errcode_ret );
            }

            HOST_PERFORMANCE_TIMING_END();
            ADD_USM_ALLOCATION( retVal, size );
            USM_ALLOC_PROPERTIES_CLEANUP( newProperties );
            CHECK_ERROR( errcode_ret[0] );
            ADD_POINTER_ALLOCATION( retVal );
            CALL_LOGGING_EXIT( errcode_ret[0], "returned %p", retVal );

            return retVal;
        }
    }

    NULL_FUNCTION_POINTER_SET_ERROR_RETURN_NULL(errcode_ret, CL_INVALID_CONTEXT);
}